

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

double __thiscall smf::MidiFile::getTimeInSeconds(MidiFile *this,int tickvalue)

{
  _TickTime *__base;
  size_type __nmemb;
  void *pvVar1;
  void *ptr;
  _TickTime key;
  int tickvalue_local;
  MidiFile *this_local;
  
  key.seconds._4_4_ = tickvalue;
  if (((this->m_timemapvalid & 1U) == 0) && (buildTimeMap(this), (this->m_timemapvalid & 1U) == 0))
  {
    this_local = (MidiFile *)0xbff0000000000000;
  }
  else {
    ptr._0_4_ = key.seconds._4_4_;
    key.tick = 0;
    key._4_4_ = 0xbff00000;
    __base = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::data(&this->m_timemap);
    __nmemb = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size(&this->m_timemap);
    pvVar1 = bsearch(&ptr,__base,__nmemb,0x10,ticksearch);
    if (pvVar1 == (void *)0x0) {
      this_local = (MidiFile *)linearSecondInterpolationAtTick(this,key.seconds._4_4_);
    }
    else {
      this_local = *(MidiFile **)((long)pvVar1 + 8);
    }
  }
  return (double)this_local;
}

Assistant:

double MidiFile::getTimeInSeconds(int tickvalue) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	_TickTime key;
	key.tick    = tickvalue;
	key.seconds = -1;

	void* ptr = bsearch(&key, m_timemap.data(), m_timemap.size(),
			sizeof(_TickTime), ticksearch);

	if (ptr == NULL) {
		// The specific tick value was not found, so do a linear
		// search for the two tick values which occur before and
		// after the tick value, and do a linear interpolation of
		// the time in seconds values to figure out the final
		// time in seconds.
		// Since the code is not yet written, kill the program at this point:
		return linearSecondInterpolationAtTick(tickvalue);
	} else {
		return ((_TickTime*)ptr)->seconds;
	}
}